

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::adv_thread_pool::anon_unknown_6::proxy_dispatcher_t::~proxy_dispatcher_t
          (proxy_dispatcher_t *this)

{
  reuse::
  proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
  ::~proxy_dispatcher_template_t(&this->super_proxy_dispatcher_base_t);
  operator_delete(this);
  return;
}

Assistant:

proxy_dispatcher_t( disp_params_t params )
			:	proxy_dispatcher_base_t( std::move(params) )
			{}